

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O0

string * __thiscall
OpenMPBindClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPBindClause *this)

{
  long lVar1;
  string local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  OpenMPBindClauseBinding local_54;
  undefined1 local_50 [4];
  OpenMPBindClauseBinding bind_binding;
  string parameter_string;
  allocator<char> local_1a;
  byte local_19;
  OpenMPBindClause *local_18;
  OpenMPBindClause *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (OpenMPBindClause *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"bind (",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  std::__cxx11::string::string((string *)local_50);
  local_54 = getBindClauseBinding(this);
  if (local_54 == OMPC_BIND_teams) {
    std::__cxx11::string::operator=((string *)local_50,"teams");
  }
  else if (local_54 == OMPC_BIND_parallel) {
    std::__cxx11::string::operator=((string *)local_50,"parallel");
  }
  else if (local_54 == OMPC_BIND_thread) {
    std::__cxx11::string::operator=((string *)local_50,"thread");
  }
  else {
    std::operator<<((ostream *)&std::cout,"The parameter of bind clause is not supported.\n");
  }
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 0) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_98,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_98);
    std::__cxx11::string::~string(local_98);
  }
  else {
    std::operator+(&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   ") ");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  local_19 = 1;
  std::__cxx11::string::~string((string *)local_50);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPBindClause::toString() {

    std::string result = "bind (";
    std::string parameter_string;
    OpenMPBindClauseBinding bind_binding = this->getBindClauseBinding();
    switch (bind_binding) {
        case OMPC_BIND_teams:
            parameter_string = "teams";
            break;
        case OMPC_BIND_parallel:
            parameter_string = "parallel";
            break;
        case OMPC_BIND_thread:
            parameter_string = "thread";
            break;
        default:
            std::cout << "The parameter of bind clause is not supported.\n";
    };

    if (parameter_string.size() > 0) {
        result += parameter_string + ") ";
    }
    else {
        result = result.substr(0, result.size()-2);
    }

    return result;
}